

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Sphere::Sphere(Sphere *this,SphereInfo *info,Vector3D *position,double scale)

{
  DiffuseBSDF *this_00;
  Spectrum local_40 [2];
  double local_28;
  double scale_local;
  Vector3D *position_local;
  SphereInfo *info_local;
  Sphere *this_local;
  
  local_28 = scale;
  scale_local = (double)position;
  position_local = (Vector3D *)info;
  info_local = (SphereInfo *)this;
  SceneObject::SceneObject(&this->super_SceneObject);
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_00394670;
  this->r = (double)*(float *)&position_local[3].x * local_28;
  Vector3D::Vector3D(&this->p,(Vector3D *)scale_local);
  if (position_local[3].y == 0.0) {
    this_00 = (DiffuseBSDF *)operator_new(0x28);
    Spectrum::Spectrum(local_40,0.5,0.5,0.5);
    DiffuseBSDF::DiffuseBSDF(this_00,local_40);
    this->bsdf = (BSDF *)this_00;
  }
  else {
    this->bsdf = *(BSDF **)((long)position_local[3].y + 0x48);
  }
  return;
}

Assistant:

Sphere::Sphere( const Collada::SphereInfo& info, 
                const Vector3D& position,
                const double scale ) : 
   p(position), r(info.radius * scale) { 
  if (info.material) {
    bsdf = info.material->bsdf;
  } else {
    bsdf = new DiffuseBSDF(Spectrum(0.5f,0.5f,0.5f));    
  }
}